

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_32sto14u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  OPJ_INT32 OVar3;
  OPJ_BYTE OVar4;
  ulong uVar5;
  sbyte sVar6;
  int iVar7;
  long lVar8;
  OPJ_BYTE *pOVar9;
  uint uVar10;
  
  uVar5 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      uVar1 = pSrc[uVar5];
      uVar2 = pSrc[uVar5 + 1];
      uVar10 = pSrc[uVar5 + 2];
      OVar3 = pSrc[uVar5 + 3];
      *pDst = (OPJ_BYTE)(uVar1 >> 6);
      pDst[1] = (byte)(uVar2 >> 0xc) | (byte)(uVar1 << 2);
      pDst[2] = (OPJ_BYTE)(uVar2 >> 4);
      pDst[3] = (byte)(uVar10 >> 10) | (byte)(uVar2 << 4);
      pDst[4] = (OPJ_BYTE)(uVar10 >> 2);
      pDst[5] = (byte)((uint)OVar3 >> 8) | (byte)(uVar10 << 6);
      pDst[6] = (OPJ_BYTE)OVar3;
      pDst = pDst + 7;
      uVar5 = uVar5 + 4;
    } while (uVar5 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    uVar1 = pSrc[uVar5];
    iVar7 = (int)(length & 3);
    if (iVar7 == 1) {
      OVar4 = (OPJ_BYTE)(uVar1 >> 6);
      sVar6 = 2;
      lVar8 = 1;
      pOVar9 = pDst;
      uVar10 = uVar1;
    }
    else {
      uVar2 = pSrc[uVar5 + 1];
      uVar10 = 0;
      if (iVar7 == 3) {
        uVar10 = pSrc[uVar5 + 2];
      }
      *pDst = (OPJ_BYTE)(uVar1 >> 6);
      pDst[1] = (byte)(uVar2 >> 0xc) | (byte)(uVar1 << 2);
      pDst[2] = (OPJ_BYTE)(uVar2 >> 4);
      pDst[3] = (byte)(uVar10 >> 10) | (byte)(uVar2 << 4);
      if (iVar7 != 3) {
        return;
      }
      pOVar9 = pDst + 4;
      OVar4 = (OPJ_BYTE)(uVar10 >> 2);
      sVar6 = 6;
      lVar8 = 5;
    }
    *pOVar9 = OVar4;
    pDst[lVar8] = (char)uVar10 << sVar6;
  }
  return;
}

Assistant:

static void tif_32sto14u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		
		*pDst++ = (OPJ_BYTE)(src0 >> 6);
		*pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
		*pDst++ = (OPJ_BYTE)(src1 >> 4);
		*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
		*pDst++ = (OPJ_BYTE)(src2 >> 2);
		*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6) | (src3 >> 8));
		*pDst++ = (OPJ_BYTE)(src3);
	}
	
	if (length & 3U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = 0U;
		OPJ_UINT32 src2 = 0U;
		length = length & 3U;
		
		if (length > 1U) {
			src1 = (OPJ_UINT32)pSrc[i+1];
			if (length > 2U) {
				src2 = (OPJ_UINT32)pSrc[i+2];
			}
		}
		*pDst++ = (OPJ_BYTE)(src0 >> 6);
		*pDst++ = (OPJ_BYTE)(((src0 & 0x3FU) << 2) | (src1 >> 12));
		if (length > 1U) {
			*pDst++ = (OPJ_BYTE)(src1 >> 4);
			*pDst++ = (OPJ_BYTE)(((src1 & 0xFU) << 4) | (src2 >> 10));
			if (length > 2U) {
				*pDst++ = (OPJ_BYTE)(src2 >> 2);
				*pDst++ = (OPJ_BYTE)(((src2 & 0x3U) << 6));
			}
		}
	}
}